

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::DefinedFunc::DoCall
          (DefinedFunc *this,Thread *thread,Values *params,Values *results,Ptr *out_trap)

{
  size_type sVar1;
  size_type sVar2;
  Store *store;
  vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_> local_98;
  allocator<char> local_79;
  string local_78;
  Ptr local_58;
  RunResult local_3c;
  Ptr *pPStack_38;
  RunResult result;
  Ptr *out_trap_local;
  Values *results_local;
  Values *params_local;
  Thread *thread_local;
  DefinedFunc *this_local;
  
  pPStack_38 = out_trap;
  out_trap_local = (Ptr *)results;
  results_local = params;
  params_local = (Values *)thread;
  thread_local = (Thread *)this;
  sVar1 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size(params);
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size
                    (&(this->super_Func).type_.params);
  if (sVar1 == sVar2) {
    Thread::PushValues((Thread *)params_local,&(this->super_Func).type_.params,results_local);
    local_3c = Thread::PushCall((Thread *)params_local,this,pPStack_38);
    if (local_3c == Trap) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      local_3c = Thread::Run((Thread *)params_local,pPStack_38);
      if (local_3c == Trap) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else if (local_3c == Exception) {
        store = Thread::store((Thread *)params_local);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_78,"uncaught exception",&local_79);
        memset(&local_98,0,0x18);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::vector(&local_98);
        Trap::New(&local_58,store,&local_78,&local_98);
        RefPtr<wabt::interp::Trap>::operator=(pPStack_38,&local_58);
        RefPtr<wabt::interp::Trap>::~RefPtr(&local_58);
        std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::~vector(&local_98);
        std::__cxx11::string::~string((string *)&local_78);
        std::allocator<char>::~allocator(&local_79);
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        Thread::PopValues((Thread *)params_local,&(this->super_Func).type_.results,
                          (Values *)out_trap_local);
        Result::Result((Result *)((long)&this_local + 4),Ok);
      }
    }
    return (Result)this_local._4_4_;
  }
  __assert_fail("params.size() == type_.params.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                ,0x1b6,
                "virtual Result wabt::interp::DefinedFunc::DoCall(Thread &, const Values &, Values &, Trap::Ptr *)"
               );
}

Assistant:

Result DefinedFunc::DoCall(Thread& thread,
                           const Values& params,
                           Values& results,
                           Trap::Ptr* out_trap) {
  assert(params.size() == type_.params.size());
  thread.PushValues(type_.params, params);
  RunResult result = thread.PushCall(*this, out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  }
  result = thread.Run(out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  } else if (result == RunResult::Exception) {
    // While this is not actually a trap, it is a convenient way
    // to report an uncaught exception.
    *out_trap = Trap::New(thread.store(), "uncaught exception");
    return Result::Error;
  }
  thread.PopValues(type_.results, &results);
  return Result::Ok;
}